

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::AddDescriptors(DescriptorTable *table)

{
  DescriptorTable *table_local;
  
  if ((table->is_initialized & 1U) == 0) {
    table->is_initialized = true;
    anon_unknown_6::AddDescriptorsImpl(table);
  }
  return;
}

Assistant:

void AddDescriptors(const DescriptorTable* table) {
  // AddDescriptors is not thread safe. Callers need to ensure calls are
  // properly serialized. This function is only called pre-main by global
  // descriptors and we can assume single threaded access or it's called
  // by AssignDescriptorImpl which uses a mutex to sequence calls.
  if (table->is_initialized) return;
  table->is_initialized = true;
  AddDescriptorsImpl(table);
}